

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_support.c
# Opt level: O3

void test_filter_or_format(undefined1 *enable)

{
  int iVar1;
  archive *paVar2;
  char *pcVar3;
  longlong v1;
  wchar_t line;
  
  paVar2 = archive_read_new();
  iVar1 = (*(code *)enable)(paVar2);
  if (iVar1 == -0x14) {
    pcVar3 = archive_error_string(paVar2);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_support.c"
                     ,L',',(uint)(pcVar3 != (char *)0x0),"NULL != archive_error_string(a)",
                     (void *)0x0);
    iVar1 = archive_errno(paVar2);
    pcVar3 = "-1";
    line = L'-';
    v1 = -1;
  }
  else {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_support.c"
                        ,L'/',0,"ARCHIVE_OK",(long)iVar1,"result",paVar2);
    pcVar3 = archive_error_string(paVar2);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_support.c"
                     ,L'0',(uint)(pcVar3 == (char *)0x0),"NULL == archive_error_string(a)",
                     (void *)0x0);
    iVar1 = archive_errno(paVar2);
    pcVar3 = "0";
    line = L'1';
    v1 = 0;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_support.c"
                      ,line,v1,pcVar3,(long)iVar1,"archive_errno(a)",paVar2);
  archive_read_free(paVar2);
  paVar2 = archive_write_new();
  iVar1 = (*(code *)enable)(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_support.c"
                      ,L':',-0x1e,"ARCHIVE_FATAL",(long)iVar1,"enable_(a)",paVar2);
  pcVar3 = archive_error_string(paVar2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_support.c"
                   ,L';',(uint)(pcVar3 != (char *)0x0),"NULL != archive_error_string(a)",(void *)0x0
                  );
  iVar1 = archive_errno(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_support.c"
                      ,L'<',-1,"-1",(long)iVar1,"archive_errno(a)",paVar2);
  archive_write_free(paVar2);
  paVar2 = archive_read_disk_new();
  iVar1 = (*(code *)enable)(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_support.c"
                      ,L':',-0x1e,"ARCHIVE_FATAL",(long)iVar1,"enable_(a)",paVar2);
  pcVar3 = archive_error_string(paVar2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_support.c"
                   ,L';',(uint)(pcVar3 != (char *)0x0),"NULL != archive_error_string(a)",(void *)0x0
                  );
  iVar1 = archive_errno(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_support.c"
                      ,L'<',-1,"-1",(long)iVar1,"archive_errno(a)",paVar2);
  archive_read_free(paVar2);
  paVar2 = archive_write_disk_new();
  iVar1 = (*(code *)enable)(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_support.c"
                      ,L':',-0x1e,"ARCHIVE_FATAL",(long)iVar1,"enable_(a)",paVar2);
  pcVar3 = archive_error_string(paVar2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_support.c"
                   ,L';',(uint)(pcVar3 != (char *)0x0),"NULL != archive_error_string(a)",(void *)0x0
                  );
  iVar1 = archive_errno(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_read_support.c"
                      ,L'<',-1,"-1",(long)iVar1,"archive_errno(a)",paVar2);
  archive_write_free(paVar2);
  return;
}

Assistant:

static void
test_filter_or_format(enabler enable)
{
	test_success(archive_read_new, enable, archive_read_free);
	test_failure(archive_write_new, enable, archive_write_free);
	test_failure(archive_read_disk_new, enable, archive_read_free);
	test_failure(archive_write_disk_new, enable, archive_write_free);
}